

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O1

LeastSq * benchmark::MinimalLeastSq
                    (LeastSq *__return_storage_ptr__,vector<int,_std::allocator<int>_> *n,
                    vector<double,_std::allocator<double>_> *time,BigOFunc *fitting_curve)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double local_50;
  
  piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_50 = 0.0;
  if ((n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      == piVar1) {
    dVar8 = NAN;
    local_50 = 0.0;
  }
  else {
    dVar7 = 0.0;
    dVar8 = 0.0;
    uVar2 = 0;
    do {
      dVar4 = (*fitting_curve)(piVar1[uVar2]);
      dVar5 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar2];
      local_50 = local_50 + dVar5;
      dVar7 = dVar7 + dVar4 * dVar4;
      dVar8 = dVar8 + dVar5 * dVar4;
      uVar2 = uVar2 + 1;
      piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar2 < (ulong)((long)(n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
    dVar8 = dVar8 / dVar7;
  }
  dVar7 = 0.0;
  __return_storage_ptr__->coef = 0.0;
  __return_storage_ptr__->rms = 0.0;
  __return_storage_ptr__->complexity = oLambda;
  __return_storage_ptr__->coef = dVar8;
  piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      == piVar1) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      dVar5 = (*fitting_curve)(piVar1[uVar3]);
      dVar5 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar3] - dVar5 * dVar8;
      dVar7 = dVar7 + dVar5 * dVar5;
      uVar3 = uVar3 + 1;
      piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar2 = (long)(n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    } while (uVar3 < uVar2);
  }
  auVar6._8_4_ = (int)(uVar2 >> 0x20);
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  dVar8 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  dVar7 = dVar7 / dVar8;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  __return_storage_ptr__->rms = dVar7 / (local_50 / dVar8);
  return __return_storage_ptr__;
}

Assistant:

LeastSq MinimalLeastSq(const std::vector<int>& n,
                       const std::vector<double>& time,
                       BigOFunc* fitting_curve) {
  double sigma_gn = 0.0;
  double sigma_gn_squared = 0.0;
  double sigma_time = 0.0;
  double sigma_time_gn = 0.0;

  // Calculate least square fitting parameter
  for (size_t i = 0; i < n.size(); ++i) {
    double gn_i = fitting_curve(n[i]);
    sigma_gn += gn_i;
    sigma_gn_squared += gn_i * gn_i;
    sigma_time += time[i];
    sigma_time_gn += time[i] * gn_i;
  }

  LeastSq result;
  result.complexity = oLambda;

  // Calculate complexity.
  result.coef = sigma_time_gn / sigma_gn_squared;

  // Calculate RMS
  double rms = 0.0;
  for (size_t i = 0; i < n.size(); ++i) {
    double fit = result.coef * fitting_curve(n[i]);
    rms += pow((time[i] - fit), 2);
  }

  // Normalized RMS by the mean of the observed values
  double mean = sigma_time / n.size();
  result.rms = sqrt(rms / n.size()) / mean;

  return result;
}